

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O3

int big2_scanAtts(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  char *pcVar5;
  int iVar6;
  int iVar7;
  byte *pbVar8;
  char **ppcVar9;
  uint uVar10;
  bool bVar11;
  byte *local_40;
  char **local_38;
  
  if (ptr == end) {
    return -1;
  }
  bVar11 = false;
  local_38 = nextTokPtr;
LAB_004d337a:
  iVar6 = 0;
  iVar4 = 0;
  bVar1 = *ptr;
  local_40 = (byte *)ptr;
  ppcVar9 = local_38;
  iVar7 = iVar4;
  if (bVar1 < 0xdc) {
    if (bVar1 != 0) {
      if (bVar1 - 0xd8 < 4) goto switchD_004d33b1_caseD_7;
      goto switchD_004d33b1_caseD_1d;
    }
    pbVar8 = (byte *)ptr;
    iVar7 = iVar6;
    switch(*(undefined1 *)((long)enc[1].scanners + (ulong)((byte *)ptr)[1])) {
    case 5:
LAB_004d3845:
      iVar7 = iVar4;
      if ((long)end - (long)local_40 < 2) {
        return -2;
      }
      break;
    case 6:
LAB_004d3859:
      iVar7 = iVar4;
      if ((long)end - (long)local_40 < 3) {
        return -2;
      }
      break;
    case 7:
switchD_004d33b1_caseD_7:
LAB_004d37d9:
      iVar7 = iVar4;
      if ((long)end - (long)local_40 < 4) {
        return -2;
      }
      break;
    case 9:
    case 10:
    case 0x15:
      do {
        ptr = (char *)(pbVar8 + 2);
        if (ptr == end) {
          return -1;
        }
        local_40 = (byte *)ptr;
        iVar7 = iVar4;
        if (*ptr != 0) goto switchD_004d33b1_caseD_8;
        bVar1 = *(byte *)((long)enc[1].scanners + (ulong)pbVar8[3]);
        pbVar8 = (byte *)ptr;
      } while ((bVar1 - 9 < 2) || (bVar1 == 0x15));
      if (bVar1 == 0xe) goto switchD_004d33b1_caseD_e;
      break;
    case 0xe:
switchD_004d33b1_caseD_e:
      pbVar8 = (byte *)ptr + 2;
      if (pbVar8 == (byte *)end) {
        return -1;
      }
      while( true ) {
        if (*pbVar8 != 0) goto switchD_004d35ce_caseD_0;
        bVar1 = *(byte *)((long)enc[1].scanners + (ulong)pbVar8[1]);
        uVar10 = (uint)bVar1;
        if ((uVar10 & 0xfffffffe) == 0xc) break;
        if ((0x15 < uVar10) || ((0x200600U >> (uVar10 & 0x1f) & 1) == 0))
        goto switchD_004d35ce_caseD_0;
        pbVar8 = pbVar8 + 2;
        if (pbVar8 == (byte *)end) {
          return -1;
        }
      }
      local_40 = pbVar8 + 2;
      if (local_40 == (byte *)end) {
        return -1;
      }
      do {
        bVar2 = *local_40;
        if (bVar2 < 0xdc) {
          bVar3 = 7;
          if (3 < bVar2 - 0xd8) {
            if (bVar2 == 0) {
              bVar3 = *(byte *)((long)enc[1].scanners + (ulong)local_40[1]);
            }
            else {
LAB_004d35a7:
              bVar3 = 0x1d;
            }
          }
        }
        else if (bVar2 - 0xdc < 4) {
          bVar3 = 8;
        }
        else if ((bVar2 != 0xff) || (bVar3 = 0, local_40[1] < 0xfe)) goto LAB_004d35a7;
        if (bVar3 == bVar1) goto LAB_004d36c0;
        pbVar8 = local_40;
        switch(bVar3) {
        case 0:
        case 1:
        case 2:
        case 8:
          goto switchD_004d35ce_caseD_0;
        case 3:
          iVar4 = big2_scanRef(enc,(char *)(local_40 + 2),end,(char **)&local_40);
          ppcVar9 = local_38;
          if (iVar4 < 1) {
            iVar7 = 0;
            if (iVar4 != 0) {
              return iVar4;
            }
            goto switchD_004d33b1_caseD_8;
          }
          break;
        default:
          goto switchD_004d35ce_caseD_4;
        case 5:
          if ((long)end - (long)local_40 < 2) {
            return -2;
          }
switchD_004d35ce_caseD_4:
          local_40 = local_40 + 2;
          break;
        case 6:
          if ((long)end - (long)local_40 < 3) {
            return -2;
          }
          local_40 = local_40 + 3;
          break;
        case 7:
          if ((long)end - (long)local_40 < 4) {
            return -2;
          }
          local_40 = local_40 + 4;
        }
        if (local_40 == (byte *)end) {
          return -1;
        }
      } while( true );
    case 0x16:
    case 0x18:
    case 0x19:
    case 0x1a:
    case 0x1b:
      goto switchD_004d33b1_caseD_16;
    case 0x17:
      iVar7 = iVar4;
      if (bVar11) break;
      local_40 = (byte *)ptr + 2;
      if (local_40 == (byte *)end) {
        return -1;
      }
      bVar1 = *local_40;
      if (bVar1 < 0xdc) {
        if (bVar1 == 0) {
          bVar2 = *(byte *)((long)enc[1].scanners + (ulong)((byte *)ptr)[3]);
          if (0x15 < bVar2) {
            if ((bVar2 != 0x16) && (bVar2 != 0x18)) {
              iVar7 = iVar6;
              if (bVar2 != 0x1d) break;
              goto LAB_004d368a;
            }
            goto LAB_004d36ad;
          }
          if (bVar2 == 5) goto LAB_004d3845;
          if (bVar2 == 6) goto LAB_004d3859;
          iVar7 = iVar6;
          if (bVar2 != 7) break;
        }
        else if (3 < bVar1 - 0xd8) goto LAB_004d368a;
        goto LAB_004d37d9;
      }
      if (bVar1 == 0xff) {
        iVar7 = iVar6;
        if (0xfd < ((byte *)ptr)[3]) break;
      }
      else {
        iVar7 = iVar6;
        if (bVar1 - 0xdc < 4) break;
      }
LAB_004d368a:
      iVar7 = iVar6;
      if ((*(uint *)((long)namingBitmap +
                    (ulong)(((byte *)ptr)[3] >> 3 & 0x1c |
                           (uint)"\x02\x03\x04\x05\x06\a\b"[bVar1] << 5)) >>
           (((byte *)ptr)[3] & 0x1f) & 1) == 0) break;
LAB_004d36ad:
      ptr = (char *)((byte *)ptr + 4);
      bVar11 = true;
      goto LAB_004d34b4;
    case 0x1d:
      goto switchD_004d33b1_caseD_1d;
    }
    goto switchD_004d33b1_caseD_8;
  }
  if (bVar1 == 0xff) {
    if (0xfd < ((byte *)ptr)[1]) goto switchD_004d33b1_caseD_8;
  }
  else if (bVar1 - 0xdc < 4) goto switchD_004d33b1_caseD_8;
switchD_004d33b1_caseD_1d:
  iVar7 = iVar4;
  if ((*(uint *)((long)namingBitmap +
                (ulong)(((byte *)ptr)[1] >> 3 & 0x1c |
                       (uint)"\x19\x03\x1a\x1b\x1c\x1d\x1e"[bVar1] << 5)) >>
       (((byte *)ptr)[1] & 0x1f) & 1) == 0) goto switchD_004d33b1_caseD_8;
switchD_004d33b1_caseD_16:
  ptr = (char *)((byte *)ptr + 2);
  goto LAB_004d34b4;
LAB_004d36c0:
  pbVar8 = local_40 + 2;
  if (pbVar8 == (byte *)end) {
    return -1;
  }
  if (*pbVar8 == 0) {
    bVar1 = *(byte *)((long)enc[1].scanners + (ulong)local_40[3]);
    uVar10 = (uint)bVar1;
    local_38 = ppcVar9;
    if (bVar1 < 0xb) {
      if (uVar10 - 9 < 2) {
LAB_004d3709:
        pbVar8 = local_40 + 4;
        if (pbVar8 == (byte *)end) {
          return -1;
        }
        pcVar5 = end + (-4 - (long)local_40);
        ptr = (char *)(local_40 + 6);
        while( true ) {
          bVar1 = ((byte *)ptr)[-2];
          if (bVar1 != 0) break;
          switch(*(undefined1 *)((long)enc[1].scanners + (ulong)((byte *)ptr)[-1])) {
          case 5:
            if ((long)pcVar5 < 2) {
              return -2;
            }
            goto switchD_004d374d_caseD_8;
          case 6:
            if ((long)pcVar5 < 3) {
              return -2;
            }
            goto switchD_004d374d_caseD_8;
          case 7:
            goto switchD_004d374d_caseD_7;
          default:
            goto switchD_004d374d_caseD_8;
          case 9:
          case 10:
          case 0x15:
            pbVar8 = pbVar8 + 2;
            pcVar5 = pcVar5 + -2;
            bVar11 = ptr == end;
            ptr = (char *)((byte *)ptr + 2);
            if (bVar11) {
              return -1;
            }
            break;
          case 0xb:
            pbVar8 = (byte *)ptr + -2;
            goto LAB_004d38d9;
          case 0x11:
            pbVar8 = (byte *)ptr + -2;
            goto LAB_004d38a9;
          case 0x16:
          case 0x18:
            goto switchD_004d374d_caseD_16;
          case 0x1d:
            goto switchD_004d374d_caseD_1d;
          }
        }
        if (bVar1 - 0xd8 < 4) {
switchD_004d374d_caseD_7:
          if ((long)pcVar5 < 4) {
            return -2;
          }
        }
        else if ((3 < bVar1 - 0xdc) && ((bVar1 != 0xff || (((byte *)ptr)[-1] < 0xfe)))) {
switchD_004d374d_caseD_1d:
          local_40 = pbVar8;
          iVar7 = 0;
          if ((*(uint *)((long)namingBitmap +
                        (ulong)(((byte *)ptr)[-1] >> 3 & 0x1c |
                               (uint)"\x02\x03\x04\x05\x06\a\b"[bVar1] << 5)) >>
               (((byte *)ptr)[-1] & 0x1f) & 1) != 0) {
switchD_004d374d_caseD_16:
            bVar11 = false;
LAB_004d34b4:
            local_38 = ppcVar9;
            if (ptr == end) {
              return -1;
            }
            goto LAB_004d337a;
          }
          goto switchD_004d33b1_caseD_8;
        }
switchD_004d374d_caseD_8:
        local_40 = (byte *)ptr + -2;
        iVar7 = 0;
        goto switchD_004d33b1_caseD_8;
      }
    }
    else {
      if (bVar1 == 0x15) goto LAB_004d3709;
      if (uVar10 == 0xb) {
LAB_004d38d9:
        local_40 = pbVar8 + 2;
        iVar7 = 1;
        goto switchD_004d33b1_caseD_8;
      }
      if (uVar10 == 0x11) {
LAB_004d38a9:
        local_40 = pbVar8 + 2;
        if (local_40 == (byte *)end) {
          return -1;
        }
        iVar7 = 0;
        if (*local_40 == 0) {
          if (pbVar8[3] == 0x3e) {
            local_40 = pbVar8 + 4;
          }
          iVar7 = (uint)(pbVar8[3] == 0x3e) * 3;
        }
        goto switchD_004d33b1_caseD_8;
      }
    }
  }
switchD_004d35ce_caseD_0:
  local_40 = pbVar8;
  local_38 = ppcVar9;
  iVar7 = 0;
switchD_004d33b1_caseD_8:
  *local_38 = (char *)local_40;
  return iVar7;
}

Assistant:

static
int PREFIX(scanAtts)(const ENCODING *enc, const char *ptr, const char *end,
                     const char **nextTokPtr)
{
#ifdef XML_NS
  int hadColon = 0;
#endif
  while (ptr != end) {
    switch (BYTE_TYPE(enc, ptr)) {
    CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
#ifdef XML_NS
    case BT_COLON:
      if (hadColon) {
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      hadColon = 1;
      ptr += MINBPC(enc);
      if (ptr == end)
        return XML_TOK_PARTIAL;
      switch (BYTE_TYPE(enc, ptr)) {
      CHECK_NMSTRT_CASES(enc, ptr, end, nextTokPtr)
      default:
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      break;
#endif
    case BT_S: case BT_CR: case BT_LF:
      for (;;) {
        int t;

        ptr += MINBPC(enc);
        if (ptr == end)
          return XML_TOK_PARTIAL;
        t = BYTE_TYPE(enc, ptr);
        if (t == BT_EQUALS)
          break;
        switch (t) {
        case BT_S:
        case BT_LF:
        case BT_CR:
          break;
        default:
          *nextTokPtr = ptr;
          return XML_TOK_INVALID;
        }
      }
    /* fall through */
    case BT_EQUALS:
      {
        int open;
#ifdef XML_NS
        hadColon = 0;
#endif
        for (;;) {
          
          ptr += MINBPC(enc);
          if (ptr == end)
            return XML_TOK_PARTIAL;
          open = BYTE_TYPE(enc, ptr);
          if (open == BT_QUOT || open == BT_APOS)
            break;
          switch (open) {
          case BT_S:
          case BT_LF:
          case BT_CR:
            break;
          default:
            *nextTokPtr = ptr;
            return XML_TOK_INVALID;
          }
        }
        ptr += MINBPC(enc);
        /* in attribute value */
        for (;;) {
          int t;
          if (ptr == end)
            return XML_TOK_PARTIAL;
          t = BYTE_TYPE(enc, ptr);
          if (t == open)
            break;
          switch (t) {
          INVALID_CASES(ptr, nextTokPtr)
          case BT_AMP:
            {
              int tok = PREFIX(scanRef)(enc, ptr + MINBPC(enc), end, &ptr);
              if (tok <= 0) {
                if (tok == XML_TOK_INVALID)
                  *nextTokPtr = ptr;
                return tok;
              }
              break;
            }
          case BT_LT:
            *nextTokPtr = ptr;
            return XML_TOK_INVALID;
          default:
            ptr += MINBPC(enc);
            break;
          }
        }
        ptr += MINBPC(enc);
        if (ptr == end)
          return XML_TOK_PARTIAL;
        switch (BYTE_TYPE(enc, ptr)) {
        case BT_S:
        case BT_CR:
        case BT_LF:
          break;
        case BT_SOL:
          goto sol;
        case BT_GT:
          goto gt;
        default:
          *nextTokPtr = ptr;
          return XML_TOK_INVALID;
        }
        /* ptr points to closing quote */
        for (;;) {
          ptr += MINBPC(enc);
          if (ptr == end)
            return XML_TOK_PARTIAL;
          switch (BYTE_TYPE(enc, ptr)) {
          CHECK_NMSTRT_CASES(enc, ptr, end, nextTokPtr)
          case BT_S: case BT_CR: case BT_LF:
            continue;
          case BT_GT:
          gt:
            *nextTokPtr = ptr + MINBPC(enc);
            return XML_TOK_START_TAG_WITH_ATTS;
          case BT_SOL:
          sol:
            ptr += MINBPC(enc);
            if (ptr == end)
              return XML_TOK_PARTIAL;
            if (!CHAR_MATCHES(enc, ptr, ASCII_GT)) {
              *nextTokPtr = ptr;
              return XML_TOK_INVALID;
            }
            *nextTokPtr = ptr + MINBPC(enc);
            return XML_TOK_EMPTY_ELEMENT_WITH_ATTS;
          default:
            *nextTokPtr = ptr;
            return XML_TOK_INVALID;
          }
          break;
        }
        break;
      }
    default:
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  }
  return XML_TOK_PARTIAL;
}